

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::caddrinfo_get_new_bucket::test_method(caddrinfo_get_new_bucket *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint uVar7;
  undefined8 uVar8;
  char *pcVar9;
  iterator in_R8;
  iterator pvVar10;
  char *pcVar11;
  iterator in_R9;
  iterator pvVar12;
  string *psVar13;
  long in_FS_OFFSET;
  bool bVar14;
  span<const_std::byte,_18446744073709551615UL> source;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar15;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  uint local_628;
  int local_624;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  vector<bool,_std::allocator<bool>_> local_540;
  NetGroupManager local_518;
  vector<bool,_std::allocator<bool>_> local_4e8;
  direct_or_indirect local_4c0;
  uint local_4b0;
  undefined1 *local_4a8;
  uint16_t local_4a0;
  direct_or_indirect local_498;
  uint local_488;
  undefined1 *local_480;
  uint16_t local_478;
  string local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  uint local_440;
  direct_or_indirect local_430;
  uint local_420;
  undefined1 *local_418;
  uint16_t local_410;
  undefined1 local_408 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  direct_or_indirect local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  direct_or_indirect local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_398;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_378;
  direct_or_indirect local_368;
  uint local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_350;
  uint16_t local_348;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count sStack_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  uint16_t local_320;
  NodeSeconds local_318;
  ServiceFlags local_310;
  direct_or_indirect local_308;
  shared_count sStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  direct_or_indirect local_2c0;
  uint local_2b0;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  undefined1 local_258 [16];
  undefined8 local_248;
  lazy_ostream *plStack_240;
  uchar local_238 [8];
  NodeSeconds NStack_230;
  ServiceFlags local_228;
  NodeSeconds NStack_220;
  NodeSeconds local_218;
  direct_or_indirect dStack_210;
  undefined8 uStack_200;
  uint64_t local_1f8;
  uint256 nKey2;
  uint256 nKey1;
  direct_or_indirect local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [3];
  direct_or_indirect local_150;
  uint local_140;
  direct_or_indirect local_118;
  uint local_108;
  direct_or_indirect local_f8;
  uint local_e8;
  undefined8 local_e0;
  undefined2 local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  undefined8 local_b8;
  undefined2 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  direct_or_indirect local_98;
  uint local_88;
  undefined8 local_80;
  undefined2 local_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  source._M_extent._M_extent_value = 0x3b;
  source._M_ptr = test::data::detail_asmap_raw;
  FromBytes(&local_4e8,source);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_540,&local_4e8);
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p._0_4_ =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._0_4_;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p._4_4_ =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p._4_4_;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._12_4_ =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_offset;
  local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ =
       local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._12_4_;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_540.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.2.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&local_198.indirect_contents,
                 0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  local_58 = local_80;
  local_50 = local_78;
  local_48 = 100000000;
  local_40 = 0;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.2.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_198.indirect_contents,9999
                );
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_b8 = local_e0;
  local_b0 = local_d8;
  local_a8 = 100000000;
  local_a0 = 0;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  local_198.indirect_contents.indirect = (char *)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"250.1.2.1","");
  ResolveIP((CNetAddr *)&local_118.indirect_contents,(string *)&local_198.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.indirect_contents.indirect != local_188) {
    operator_delete(local_198.indirect_contents.indirect,
                    CONCAT44(local_188[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_188[0]._M_allocated_capacity) + 1);
  }
  AddrInfo::AddrInfo((AddrInfo *)&local_198.indirect_contents,
                     (CAddress *)&local_70.indirect_contents,
                     (CNetAddr *)&local_118.indirect_contents);
  dStack_210.direct[8] = '\0';
  dStack_210.direct[9] = '\0';
  dStack_210.direct[10] = '\0';
  dStack_210.direct[0xb] = '\0';
  dStack_210.direct[0xc] = '\0';
  dStack_210.direct[0xd] = '\0';
  dStack_210.direct[0xe] = '\0';
  dStack_210.direct[0xf] = '\0';
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218.__d.__r = (duration)0;
  dStack_210.indirect_contents.indirect = (char *)0x0;
  local_228 = NODE_NONE;
  NStack_220.__d.__r = (duration)0;
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  NStack_230.__d.__r = (duration)0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  plStack_240 = (lazy_ostream *)0x0;
  local_258._0_8_ = (_func_int **)0x0;
  local_258._8_8_ = 0;
  local_1f8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_258);
  local_308._0_4_ = 1;
  CSHA256::Write((CSHA256 *)local_258,(uchar *)local_308.direct,4);
  HashWriter::GetHash(&nKey1,(HashWriter *)local_258);
  dStack_210.direct[8] = '\0';
  dStack_210.direct[9] = '\0';
  dStack_210.direct[10] = '\0';
  dStack_210.direct[0xb] = '\0';
  dStack_210.direct[0xc] = '\0';
  dStack_210.direct[0xd] = '\0';
  dStack_210.direct[0xe] = '\0';
  dStack_210.direct[0xf] = '\0';
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  local_218.__d.__r = (duration)0;
  dStack_210.indirect_contents.indirect = (char *)0x0;
  local_228 = NODE_NONE;
  NStack_220.__d.__r = (duration)0;
  local_238[0] = '\0';
  local_238[1] = '\0';
  local_238[2] = '\0';
  local_238[3] = '\0';
  local_238[4] = '\0';
  local_238[5] = '\0';
  local_238[6] = '\0';
  local_238[7] = '\0';
  NStack_230.__d.__r = (duration)0;
  local_248._0_4_ = 0;
  local_248._4_4_ = 0;
  plStack_240 = (lazy_ostream *)0x0;
  local_258._0_8_ = (_func_int **)0x0;
  local_258._8_8_ = 0;
  local_1f8 = 0;
  CSHA256::CSHA256((CSHA256 *)local_258);
  local_308._0_4_ = 2;
  CSHA256::Write((CSHA256 *)local_258,(uchar *)local_308.direct,4);
  HashWriter::GetHash(&nKey2,(HashWriter *)local_258);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x28c;
  file.m_begin = (iterator)&local_550;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_560,msg);
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_01388f08;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf4aea1;
  local_3e8._M_allocated_capacity._0_4_ =
       AddrInfo::GetNewBucket
                 ((AddrInfo *)&local_198.indirect_contents,&nKey1,
                  (CNetAddr *)&local_150.indirect_contents,&local_518);
  local_3a8.indirect_contents.indirect = (char *)&local_3e8;
  local_3c8.indirect_contents.indirect = local_408;
  local_408._0_4_ = 0x31b;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._8_8_ = "";
  plStack_240 = (lazy_ostream *)&local_3a8;
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013890c8;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_3c8;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013890c8;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  buckets._M_t._M_impl._0_1_ = local_3e8._M_allocated_capacity._0_4_ == 0x31b;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&buckets,(lazy_ostream *)&bucket,1,2,REQUIRE,0xe31bbb,
             (size_t)local_388,0x28c,(HashWriter *)local_258,"795",&local_308);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x28d;
  file_00.m_begin = (iterator)&local_570;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_580,
             msg_00);
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_01388f08;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf4aea1;
  local_3e8._M_allocated_capacity._0_4_ =
       AddrInfo::GetNewBucket
                 ((AddrInfo *)&local_198.indirect_contents,&nKey1,
                  (CNetAddr *)&local_118.indirect_contents,&local_518);
  local_408._0_4_ = 0x31b;
  buckets._M_t._M_impl._0_1_ = local_3e8._M_allocated_capacity._0_4_ == 0x31b;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_388._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_388._8_8_ = "";
  local_3a8.indirect_contents.indirect = (char *)&local_3e8;
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013890c8;
  local_248 = boost::unit_test::lazy_ostream::inst;
  plStack_240 = (lazy_ostream *)&local_3a8;
  local_3c8.indirect_contents.indirect = local_408;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013890c8;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_3c8;
  pvVar10 = (iterator)0x1;
  pvVar12 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&buckets,(lazy_ostream *)&bucket,1,2,REQUIRE,0xe31be0,
             (size_t)local_388,0x28d,(HashWriter *)local_258,"795",&local_308);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x291;
  file_01.m_begin = (iterator)&local_590;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_5a0,
             msg_01);
  iVar3 = AddrInfo::GetNewBucket
                    ((AddrInfo *)&local_198.indirect_contents,&nKey1,
                     (CNetAddr *)&local_150.indirect_contents,&local_518);
  _cVar15 = 0x23bb63;
  iVar4 = AddrInfo::GetNewBucket
                    ((AddrInfo *)&local_198.indirect_contents,&nKey2,
                     (CNetAddr *)&local_150.indirect_contents,&local_518);
  local_308.direct[0] = iVar3 != iVar4;
  local_308._8_8_ = (element_type *)0x0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  _bucket = (undefined **)0xe31c0e;
  local_338 = (long)"info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap)" +
              0x4c;
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_01389048;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a8 = "";
  pvVar10 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  plStack_240 = (lazy_ostream *)&bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_308,(lazy_ostream *)local_258,1,0,WARN,_cVar15,
             (size_t)&local_5b0,0x291);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  AddrInfo::AddrInfo((AddrInfo *)local_258,(CAddress *)&local_d0.indirect_contents,
                     (CNetAddr *)&local_118.indirect_contents);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x295;
  file_02.m_begin = (iterator)&local_5c0;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5d0,
             msg_02);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&local_198.indirect_contents);
  _cVar15 = 0x23bc80;
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
                   (CService *)local_258);
  bVar14 = true;
  if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - buckets._M_t._M_impl._0_8_ ==
      local_388._8_8_ - local_388._0_8_) {
    if (buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == buckets._M_t._M_impl._0_8_) {
      bVar14 = false;
    }
    else {
      _cVar15 = 0x23bcba;
      iVar3 = bcmp((void *)buckets._M_t._M_impl._0_8_,(void *)local_388._0_8_,
                   buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                   buckets._M_t._M_impl._0_8_);
      bVar14 = iVar3 != 0;
    }
  }
  bucket._0_1_ = bVar14;
  local_338 = (element_type *)0x0;
  sStack_330.pi_ = (sp_counted_base *)0x0;
  local_3a8.indirect_contents.indirect = "info1.GetKey() != info2.GetKey()";
  local_3a8._8_8_ = (long)"info1.GetKey() != info2.GetKey()" + 0x20;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_3a8;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d8 = "";
  pvVar10 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&local_308,1,0,WARN,_cVar15,
             (size_t)&local_5e0,0x295);
  boost::detail::shared_count::~shared_count(&sStack_330);
  if ((pointer)local_388._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_388._0_8_,aStack_378._M_allocated_capacity - local_388._0_8_);
  }
  if (buckets._M_t._M_impl._0_8_ != 0) {
    operator_delete((void *)buckets._M_t._M_impl._0_8_,
                    (long)buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                    buckets._M_t._M_impl._0_8_);
  }
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x296;
  file_03.m_begin = (iterator)&local_5f0;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_600,
             msg_03);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  buckets._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01388f08;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xf4aea1;
  iVar3 = AddrInfo::GetNewBucket
                    ((AddrInfo *)&local_198.indirect_contents,&nKey1,
                     (CNetAddr *)&local_150.indirect_contents,&local_518);
  local_408._0_4_ = iVar3;
  local_450._M_allocated_capacity._0_4_ =
       AddrInfo::GetNewBucket
                 ((AddrInfo *)local_258,&nKey1,(CNetAddr *)&dStack_210.indirect_contents,&local_518)
  ;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  local_388[0] = local_408._0_4_ == local_450._M_allocated_capacity._0_4_;
  local_388._8_8_ = (element_type *)0x0;
  aStack_378._M_allocated_capacity = 0;
  local_3a8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3a8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3c8.indirect_contents.indirect = local_408;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013890c8;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_3c8;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_013890c8;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = &local_3e8;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_388,(lazy_ostream *)&buckets,1,2,REQUIRE,0xe31bbb,
             (size_t)&local_3a8,0x296,(lazy_ostream *)&local_308,
             "info2.GetNewBucket(nKey1, ngm_asmap)",(assertion_result *)&bucket);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_378._M_allocated_capacity);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_450._M_allocated_capacity = (ulong)(uint)local_450._M_allocated_capacity._4_4_ << 0x20;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    util::ToString<int>((string *)&local_3a8,(int *)local_450._M_local_buf);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)&local_3a8,0,0,"250.1.1.",8);
    local_388._0_8_ = &aStack_378;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if (paVar1 == paVar6) {
      aStack_378._M_allocated_capacity = paVar6->_M_allocated_capacity;
      aStack_378._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      aStack_378._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_388._0_8_ = paVar1;
    }
    local_388._8_8_ = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_368.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368.indirect_contents);
    local_328 = local_350;
    local_320 = local_348;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    util::ToString<int>((string *)local_408,(int *)local_450._M_local_buf);
    pvVar12 = &DAT_00000008;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((string *)local_408,0,0,"250.1.1.",8);
    local_3e8._M_allocated_capacity = (size_type)&local_3d8;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if (paVar1 == paVar6) {
      local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_3d8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_3e8._M_allocated_capacity = (size_type)paVar1;
    }
    local_3e8._8_8_ = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    ResolveIP((CNetAddr *)&local_3c8,(string *)&local_3e8);
    AddrInfo::AddrInfo((AddrInfo *)&local_308,(CAddress *)&bucket,(CNetAddr *)&local_3c8);
    if (0x10 < (uint)local_3b8._M_allocated_capacity._0_4_) {
      free(local_3c8.indirect_contents.indirect);
      local_3c8.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity != &local_3d8) {
      operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
      operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_358) {
      free(local_368.indirect_contents.indirect);
      local_368.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &aStack_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.indirect_contents.indirect != &aStack_398) {
      operator_delete(local_3a8.indirect_contents.indirect,aStack_398._M_allocated_capacity + 1);
    }
    iVar3 = AddrInfo::GetNewBucket
                      ((AddrInfo *)&local_308,&nKey1,(CNetAddr *)&local_2c0.indirect_contents,
                       &local_518);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < local_2b0) {
      free(local_2c0.indirect_contents.indirect);
      local_2c0.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < (uint)sStack_2f8.pi_) {
      free(local_308.indirect_contents.indirect);
    }
    uVar2 = local_450._M_allocated_capacity._0_4_;
    local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ + 1;
  } while ((int)uVar2 < 0xfe);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2a2;
  file_04.m_begin = (iterator)&local_610;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_620,
             msg_04);
  uVar7 = 0;
  local_388._8_8_ = local_388._8_8_ & 0xffffffffffffff00;
  local_388._0_8_ = &PTR__lazy_ostream_01388f08;
  aStack_378._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_378._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_450._M_allocated_capacity = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_408._0_8_ = &local_470;
  local_470._M_dataplus._M_p._0_4_ = 1;
  local_3a8.direct[0] = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 1;
  local_3a8._8_8_ = (element_type *)0x0;
  aStack_398._M_allocated_capacity = 0;
  local_3c8.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c8._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_3e8._M_allocated_capacity = (size_type)&local_450;
  local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
  local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f0 = &local_3e8;
  local_338 = local_338 & 0xffffffffffffff00;
  _bucket = &PTR__lazy_ostream_01388f88;
  sStack_330.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408;
  psVar13 = (string *)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3a8,(lazy_ostream *)local_388,1,2,REQUIRE,0xf97a12,
             (size_t)&local_3c8,0x2a2,&local_308,"1U",(CAddress *)&bucket);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_398._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  do {
    local_624 = (uVar7 & 0xffff) / 0xff + 0xfa;
    util::ToString<int>((string *)&local_3e8,&local_624);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3e8,".");
    local_3c8.indirect_contents.indirect = (char *)&local_3b8;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if (paVar1 == paVar6) {
      local_3b8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_3b8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      local_3b8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_3c8.indirect_contents.indirect = (char *)paVar1;
    }
    local_3c8._8_8_ = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    local_628 = uVar7 & 0xff;
    util::ToString<int>((string *)local_408,(int *)&local_628);
    uVar8 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.indirect_contents.indirect != &local_3b8) {
      uVar8 = local_3b8._M_allocated_capacity;
    }
    pcVar11 = (char *)local_3c8._8_8_;
    if ((ulong)uVar8 < (char *)(local_408._8_8_ + local_3c8._8_8_)) {
      psVar13 = (string *)(local_408 + 0x10);
      pcVar9 = (char *)0xf;
      if ((string *)local_408._0_8_ != psVar13) {
        pcVar9 = (char *)local_408._16_8_;
      }
      if (pcVar9 < (char *)(local_408._8_8_ + local_3c8._8_8_)) goto LAB_0023c556;
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_408,0,0,local_3c8.indirect_contents.indirect,local_3c8._8_8_);
    }
    else {
LAB_0023c556:
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_3c8,(char *)local_408._0_8_,local_408._8_8_);
    }
    local_3a8.indirect_contents.indirect = (char *)&aStack_398;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
    paVar1 = &pbVar5->field_2;
    if (paVar6 == paVar1) {
      aStack_398._M_allocated_capacity = paVar1->_M_allocated_capacity;
      aStack_398._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      aStack_398._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_3a8.indirect_contents.indirect = (char *)paVar6;
    }
    local_3a8._8_8_ = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar5->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3a8,".1.1");
    local_388._0_8_ = &aStack_378;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if (paVar1 == paVar6) {
      aStack_378._M_allocated_capacity = paVar6->_M_allocated_capacity;
      aStack_378._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    }
    else {
      aStack_378._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_388._0_8_ = paVar1;
    }
    local_388._8_8_ = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    ResolveService((CService *)&local_430.indirect_contents,(string *)local_388,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_430.indirect_contents);
    local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418;
    local_320 = local_410;
    local_318.__d.__r = (duration)100000000;
    local_310 = NODE_NONE;
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"251.4.1.1","");
    ResolveIP((CNetAddr *)&local_450,&local_470);
    AddrInfo::AddrInfo((AddrInfo *)&local_308,(CAddress *)&bucket,(CNetAddr *)&local_450);
    if (0x10 < local_440) {
      free((void *)local_450._M_allocated_capacity);
      local_450._M_allocated_capacity = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    if (0x10 < (uint)sStack_330.pi_) {
      free(_bucket);
      _bucket = (_func_int **)0x0;
    }
    if (0x10 < local_420) {
      free(local_430.indirect_contents.indirect);
      local_430.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &aStack_378) {
      operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.indirect_contents.indirect != &aStack_398) {
      operator_delete(local_3a8.indirect_contents.indirect,aStack_398._M_allocated_capacity + 1);
    }
    if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8.indirect_contents.indirect != &local_3b8) {
      operator_delete(local_3c8.indirect_contents.indirect,
                      (ulong)(local_3b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_allocated_capacity != &local_3d8) {
      operator_delete((void *)local_3e8._M_allocated_capacity,local_3d8._M_allocated_capacity + 1);
    }
    iVar3 = AddrInfo::GetNewBucket
                      ((AddrInfo *)&local_308,&nKey1,(CNetAddr *)&local_2c0.indirect_contents,
                       &local_518);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    if (0x10 < local_2b0) {
      free(local_2c0.indirect_contents.indirect);
      local_2c0.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < (uint)sStack_2f8.pi_) {
      free(local_308.indirect_contents.indirect);
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x3fc) {
      local_638 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_630 = "";
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      local_640 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar15 = 0x23c8d9;
      file_05.m_end = (iterator)0x2af;
      file_05.m_begin = (iterator)&local_638;
      msg_05.m_end = (iterator)psVar13;
      msg_05.m_begin = pcVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_648,
                 msg_05);
      bucket._0_1_ = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x41;
      local_338 = (element_type *)0x0;
      sStack_330.pi_ = (sp_counted_base *)0x0;
      local_388._0_8_ = "buckets.size() <= 64";
      local_388._8_8_ = "";
      local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
      local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
      sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388;
      local_658 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_650 = "";
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bucket,(lazy_ostream *)&local_308,1,0,WARN,_cVar15,
                 (size_t)&local_658,0x2af);
      boost::detail::shared_count::~shared_count(&sStack_330);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (&buckets._M_t);
      local_450._M_allocated_capacity = local_450._M_allocated_capacity & 0xffffffff00000000;
      do {
        local_388._0_8_ = &aStack_378;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"250.1.1.1","");
        ResolveService((CService *)&local_498.indirect_contents,(string *)local_388,0);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_498.indirect_contents)
        ;
        local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_480;
        local_320 = local_478;
        local_318.__d.__r = (duration)100000000;
        local_310 = NODE_NONE;
        util::ToString<int>((string *)local_408,(int *)local_450._M_local_buf);
        pvVar12 = (iterator)0x4;
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((string *)local_408,0,0,"101.",4);
        local_3e8._M_allocated_capacity = (size_type)&local_3d8;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if (paVar1 == paVar6) {
          local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3d8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3e8._M_allocated_capacity = (size_type)paVar1;
        }
        local_3e8._8_8_ = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3e8,".1.1");
        local_3c8.indirect_contents.indirect = (char *)&local_3b8;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if (paVar1 == paVar6) {
          local_3b8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3b8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_3b8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3c8.indirect_contents.indirect = (char *)paVar1;
        }
        local_3c8._8_8_ = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        ResolveIP((CNetAddr *)&local_3a8,(string *)&local_3c8);
        AddrInfo::AddrInfo((AddrInfo *)&local_308,(CAddress *)&bucket,(CNetAddr *)&local_3a8);
        if (0x10 < (uint)aStack_398._M_allocated_capacity._0_4_) {
          free(local_3a8.indirect_contents.indirect);
          local_3a8.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.indirect_contents.indirect != &local_3b8) {
          operator_delete(local_3c8.indirect_contents.indirect,
                          (ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_allocated_capacity != &local_3d8) {
          operator_delete((void *)local_3e8._M_allocated_capacity,
                          local_3d8._M_allocated_capacity + 1);
        }
        if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        if (0x10 < (uint)sStack_330.pi_) {
          free(_bucket);
          _bucket = (_func_int **)0x0;
        }
        if (0x10 < local_488) {
          free(local_498.indirect_contents.indirect);
          local_498.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._0_8_ != &aStack_378) {
          operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
        }
        iVar3 = AddrInfo::GetNewBucket
                          ((AddrInfo *)&local_308,&nKey1,(CNetAddr *)&local_2c0.indirect_contents,
                           &local_518);
        bucket = iVar3;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &buckets,&bucket);
        if (0x10 < local_2b0) {
          free(local_2c0.indirect_contents.indirect);
          local_2c0.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < (uint)sStack_2f8.pi_) {
          free(local_308.indirect_contents.indirect);
        }
        uVar2 = local_450._M_allocated_capacity._0_4_;
        local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ + 1;
      } while ((int)uVar2 < 0xfe);
      local_668 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_660 = "";
      local_678 = &boost::unit_test::basic_cstring<char_const>::null;
      local_670 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar15 = 0x23cd05;
      file_06.m_end = (iterator)0x2bb;
      file_06.m_begin = (iterator)&local_668;
      msg_06.m_end = pvVar10;
      msg_06.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_678,
                 msg_06);
      bucket._0_1_ = 1 < buckets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_338 = (element_type *)0x0;
      sStack_330.pi_ = (sp_counted_base *)0x0;
      local_388._0_8_ = "buckets.size() > 1";
      local_388._8_8_ = "";
      local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
      local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
      sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_688 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_680 = "";
      pvVar10 = (iterator)0x0;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bucket,(lazy_ostream *)&local_308,1,0,WARN,_cVar15,
                 (size_t)&local_688,699);
      boost::detail::shared_count::~shared_count(&sStack_330);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (&buckets._M_t);
      local_450._M_allocated_capacity = local_450._M_allocated_capacity & 0xffffffff00000000;
      do {
        local_388._0_8_ = &aStack_378;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"250.1.1.1","");
        ResolveService((CService *)&local_4c0.indirect_contents,(string *)local_388,0);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_4c0.indirect_contents)
        ;
        local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4a8;
        local_320 = local_4a0;
        local_318.__d.__r = (duration)100000000;
        local_310 = NODE_NONE;
        util::ToString<int>((string *)local_408,(int *)local_450._M_local_buf);
        pvVar12 = (iterator)0x4;
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((string *)local_408,0,0,"250.",4);
        local_3e8._M_allocated_capacity = (size_type)&local_3d8;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if (paVar1 == paVar6) {
          local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3d8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_3d8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3e8._M_allocated_capacity = (size_type)paVar1;
        }
        local_3e8._8_8_ = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3e8,".1.1");
        local_3c8.indirect_contents.indirect = (char *)&local_3b8;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        paVar6 = &pbVar5->field_2;
        if (paVar1 == paVar6) {
          local_3b8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3b8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_3b8._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_3c8.indirect_contents.indirect = (char *)paVar1;
        }
        local_3c8._8_8_ = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        ResolveIP((CNetAddr *)&local_3a8,(string *)&local_3c8);
        AddrInfo::AddrInfo((AddrInfo *)&local_308,(CAddress *)&bucket,(CNetAddr *)&local_3a8);
        if (0x10 < (uint)aStack_398._M_allocated_capacity._0_4_) {
          free(local_3a8.indirect_contents.indirect);
          local_3a8.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8.indirect_contents.indirect != &local_3b8) {
          operator_delete(local_3c8.indirect_contents.indirect,
                          (ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_allocated_capacity != &local_3d8) {
          operator_delete((void *)local_3e8._M_allocated_capacity,
                          local_3d8._M_allocated_capacity + 1);
        }
        if ((string *)local_408._0_8_ != (string *)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        if (0x10 < (uint)sStack_330.pi_) {
          free(_bucket);
          _bucket = (_func_int **)0x0;
        }
        if (0x10 < local_4b0) {
          free(local_4c0.indirect_contents.indirect);
          local_4c0.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._0_8_ != &aStack_378) {
          operator_delete((void *)local_388._0_8_,(ulong)(aStack_378._M_allocated_capacity + 1));
        }
        iVar3 = AddrInfo::GetNewBucket
                          ((AddrInfo *)&local_308,&nKey1,(CNetAddr *)&local_2c0.indirect_contents,
                           &local_518);
        bucket = iVar3;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &buckets,&bucket);
        if (0x10 < local_2b0) {
          free(local_2c0.indirect_contents.indirect);
          local_2c0.indirect_contents.indirect = (char *)0x0;
        }
        if (0x10 < (uint)sStack_2f8.pi_) {
          free(local_308.indirect_contents.indirect);
        }
        uVar2 = local_450._M_allocated_capacity._0_4_;
        local_450._M_allocated_capacity._0_4_ = local_450._M_allocated_capacity._0_4_ + 1;
      } while ((int)uVar2 < 0xfe);
      local_698 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_690 = "";
      local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar15 = 0x23d129;
      file_07.m_end = (iterator)0x2c7;
      file_07.m_begin = (iterator)&local_698;
      msg_07.m_end = pvVar10;
      msg_07.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_6a8,
                 msg_07);
      bucket._0_1_ = buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 1;
      local_338 = (element_type *)0x0;
      sStack_330.pi_ = (sp_counted_base *)0x0;
      local_388._0_8_ = "buckets.size() == 1";
      local_388._8_8_ = "";
      local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
      local_308.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
      sStack_2f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_6b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_6b0 = "";
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&bucket,(lazy_ostream *)&local_308,1,0,WARN,_cVar15,
                 (size_t)&local_6b8,0x2c7);
      boost::detail::shared_count::~shared_count(&sStack_330);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&buckets._M_t);
      if (0x10 < (size_type)uStack_200) {
        free(dStack_210.indirect_contents.indirect);
        dStack_210.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < (size_type)local_248) {
        free((void *)local_258._0_8_);
      }
      if (0x10 < local_140) {
        free(local_150.indirect_contents.indirect);
        local_150.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < (uint)local_188[0]._0_4_) {
        free(local_198.indirect_contents.indirect);
      }
      if (0x10 < local_108) {
        free(local_118.indirect_contents.indirect);
      }
      if (0x10 < local_c0) {
        free(local_d0.indirect_contents.indirect);
      }
      if (0x10 < local_60) {
        free(local_70.indirect_contents.indirect);
      }
      if (local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_518.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      }
      if (local_4e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_4e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_4e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_4e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_new_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.2.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.2.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.2.1");

    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    // Test: Make sure the buckets are what we expect
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), 795);
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, source1, ngm_asmap), 795);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetNewBucket(nKey1, ngm_asmap) != info1.GetNewBucket(nKey2, ngm_asmap));

    // Test: Ports should not affect bucket placement in the addr
    AddrInfo info2 = AddrInfo(addr2, source1);
    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK_EQUAL(info1.GetNewBucket(nKey1, ngm_asmap), info2.GetNewBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix
    // usually map to the same bucket.
    BOOST_CHECK_EQUAL(buckets.size(), 1U);

    buckets.clear();
    for (int j = 0; j < 4 * 255; j++) {
        AddrInfo infoj = AddrInfo(CAddress(
                                        ResolveService(
                                            ToString(250 + (j / 255)) + "." + ToString(j % 256) + ".1.1"), NODE_NONE),
            ResolveIP("251.4.1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same source /16 prefix should not map to more
    // than 64 buckets.
    BOOST_CHECK(buckets.size() <= 64);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("101." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes usually map to MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() > 1);

    buckets.clear();
    for (int p = 0; p < 255; p++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250.1.1.1"), NODE_NONE),
            ResolveIP("250." + ToString(p) + ".1.1"));
        int bucket = infoj.GetNewBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different source /16 prefixes sometimes map to NO MORE
    // than 1 bucket.
    BOOST_CHECK(buckets.size() == 1);
}